

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void checkArguments(char **argv,size_t *numProducers,size_t *numConsumers,size_t *buffer_capacity,
                   size_t *target)

{
  char *pcVar1;
  int *piVar2;
  uintmax_t uVar3;
  ostream *poVar4;
  size_t sVar5;
  uintmax_t *puVar6;
  ulong uVar7;
  char local_49;
  uintmax_t *local_48;
  uintmax_t *local_40;
  uintmax_t *local_38;
  
  uVar7 = 1;
  local_48 = target;
  local_40 = numConsumers;
  local_38 = buffer_capacity;
  do {
    pcVar1 = argv[uVar7];
    if (*pcVar1 == '-') goto LAB_00103660;
    piVar2 = __errno_location();
    *piVar2 = 0;
    uVar3 = strtoumax(pcVar1,(char **)0x0,10);
    if ((*piVar2 == 0x22) || (uVar3 == 0)) goto LAB_00103660;
    puVar6 = numProducers;
    switch((uint)uVar7 & 0xff) {
    case 1:
      break;
    case 2:
      puVar6 = local_40;
      break;
    case 3:
      puVar6 = local_38;
      break;
    case 4:
      *local_48 = uVar3;
      return;
    default:
      goto switchD_00103643_default;
    }
    *puVar6 = uVar3;
switchD_00103643_default:
    uVar7 = uVar7 + 1;
  } while (uVar7 != 5);
  uVar7 = 5;
LAB_00103660:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"argument ",9);
  local_49 = (char)uVar7;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_49,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (\'",3);
  pcVar1 = argv[uVar7 & 0xff];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar1,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"\') not valid. Please provide a positive integer no greater than ",0x40);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
  pcVar1 = *argv;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10a268);
  }
  else {
    sVar5 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             " <# producer threads> <# consumer threads> <buffer size> <# items to produce>",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return;
}

Assistant:

void checkArguments(const char *argv[], std::size_t *numProducers, std::size_t *numConsumers, std::size_t *buffer_capacity, std::size_t *target){
    std::size_t argCheck;
    unsigned char i = 1;
    for(; i < 5; ++i){//Ensure all provided arguments are valid
	if(argv[i][0] == '-')
	    break;
	errno = 0;
	argCheck = std::strtoumax(argv[i], NULL, 10);
	if(errno == ERANGE || argCheck == 0)
	    break;
        switch(i){
            case 1:
                *numProducers = argCheck;
                continue;
            case 2:
                *numConsumers = argCheck;
                continue;
            case 3:
		*buffer_capacity = argCheck;
                continue;
            case 4:
		*target = argCheck;
		return;
        }
    }
    std::cerr << "argument " << i << " (\'" << argv[i] << "\') not valid. Please provide a positive integer no greater than " << SIZE_MAX << std::endl;
    std::cerr << "Usage: " << argv[0] << " <# producer threads> <# consumer threads> <buffer size> <# items to produce>" << std::endl;
}